

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

Object<cmCMakePresetsGraph::ConfigurePreset> * __thiscall
cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::
Bind<cmCMakePresetsGraph::Preset,std::__cxx11::string,bool(*)(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>
          (Object<cmCMakePresetsGraph::ConfigurePreset> *this,string_view *name,
          offset_in_Preset_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          member,_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_Value_ptr_cmJSONState_ptr
                 *func,bool required)

{
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_10 = std::
             _Function_handler<bool_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
             ::_M_manager;
  local_28._M_unused._0_8_ = (undefined8)func;
  local_28._8_8_ = member;
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_28,required);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(
        name,
        [func, member](T& out, const Json::Value* value, cmJSONState* state)
          -> bool { return func(out.*member, value, state); },
        required);
    }